

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcopy.cpp
# Opt level: O2

void init_point_lists(void)

{
  Am_Point_List aAStack_18 [16];
  
  Am_Point_List::Am_Point_List(aAStack_18,init_point_lists::diamond_array,10);
  Am_Point_List::operator=((Am_Point_List *)polygon1,aAStack_18);
  Am_Point_List::~Am_Point_List(aAStack_18);
  Am_Point_List::Am_Point_List(aAStack_18,(Am_Point_List *)polygon1);
  Am_Point_List::operator=((Am_Point_List *)polygon2,aAStack_18);
  Am_Point_List::~Am_Point_List(aAStack_18);
  Am_Point_List::Am_Point_List(aAStack_18,(Am_Point_List *)polygon2);
  Am_Point_List::operator=((Am_Point_List *)polygon3,aAStack_18);
  Am_Point_List::~Am_Point_List(aAStack_18);
  Am_Point_List::Am_Point_List(aAStack_18,(Am_Point_List *)polygon1);
  Am_Point_List::operator=((Am_Point_List *)polygon4,aAStack_18);
  Am_Point_List::~Am_Point_List(aAStack_18);
  return;
}

Assistant:

void
init_point_lists()
{

  static int diamond_array[10] = {75, 10, 10, 50, 75, 90, 140, 50, 75, 10};
  polygon1 = Am_Point_List(diamond_array, 10);

  polygon2 = Am_Point_List(polygon1);
  polygon3 = Am_Point_List(polygon2);
  polygon4 = Am_Point_List(polygon1);
}